

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::AssertionNode::AnnotatePass1
          (AssertionNode *this,Compiler *compiler,bool parentNotInLoop,bool parentAtLeastOnce,
          bool parentNotSpeculative,bool parentNotNegated)

{
  uint16 *puVar1;
  Node *pNVar2;
  uint uVar3;
  CharSet<char16_t> *pCVar4;
  byte bVar5;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  
  ThreadContext::ProbeStackNoDispose
            (compiler->scriptContext->threadContext,0x6000,compiler->scriptContext,(PVOID)0x0);
  (this->super_Node).features = 0x1000;
  (*this->body->_vptr_Node[7])
            (this->body,compiler,CONCAT71(in_register_00000011,parentNotInLoop) & 0xffffffff,
             CONCAT71(in_register_00000009,parentAtLeastOnce) & 0xffffffff,0,
             (ulong)((this->isNegation ^ 1U) & parentNotNegated));
  pNVar2 = this->body;
  puVar1 = &(this->super_Node).features;
  *puVar1 = *puVar1 | pNVar2->features;
  (this->super_Node).thisConsumes.lower = 0;
  (this->super_Node).thisConsumes.upper = 0;
  bVar5 = this->isNegation;
  if ((bool)bVar5 == true) {
    pCVar4 = StandardChars<char16_t>::GetFullSet(compiler->standardChars);
    bVar5 = this->isNegation;
  }
  else {
    pCVar4 = pNVar2->firstSet;
  }
  (this->super_Node).firstSet = pCVar4;
  uVar3 = *(uint *)&(this->super_Node).field_0xc;
  *(uint *)&(this->super_Node).field_0xc = uVar3 & 0xfffffffe;
  if ((bVar5 & 1) == 0) {
    uVar3 = uVar3 & 0xfffffffc | *(uint *)&this->body->field_0xc & 2;
  }
  else {
    uVar3 = uVar3 & 0xfffffffc;
  }
  *(uint *)&(this->super_Node).field_0xc =
       (uVar3 & 0xffffc3cf) +
       ((uint)parentNotInLoop << 10 | (uint)parentAtLeastOnce << 0xb |
        (uint)parentNotSpeculative << 0xc | (uint)parentNotNegated << 0xd) + 0x30;
  return;
}

Assistant:

void AssertionNode::AnnotatePass1(Compiler& compiler, bool parentNotInLoop, bool parentAtLeastOnce, bool parentNotSpeculative, bool parentNotNegated)
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        features = HasAssertion;
        body->AnnotatePass1(compiler, parentNotInLoop, parentAtLeastOnce, false, parentNotNegated && !isNegation);
        features |= body->features;
        thisConsumes.Exact(0);
        if (isNegation)
            firstSet = compiler.standardChars->GetFullSet();
        else
            firstSet = body->firstSet;
        isFirstExact = false;
        if (isNegation)
            // This will always fail
            isThisIrrefutable = false;
        else
            // If body is irrefutable overall assertion is irrefutable
            isThisIrrefutable = body->isThisIrrefutable;
        isThisWillNotProgress = true;
        isThisWillNotRegress = true;
        isNotInLoop = parentNotInLoop;
        isAtLeastOnce = parentAtLeastOnce;
        isNotSpeculative = parentNotSpeculative;
        isNotNegated = parentNotNegated;
    }